

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O0

void htest_one_block(j_compress_ptr cinfo,JCOEFPTR block,int last_dc_val,long *dc_counts,
                    long *ac_counts)

{
  long in_RCX;
  int in_EDX;
  short *in_RSI;
  long *in_RDI;
  long *in_R8;
  int r;
  int k;
  int nbits;
  int temp;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  
  local_2c = *in_RSI - in_EDX;
  if (local_2c < 0) {
    local_2c = -local_2c;
  }
  local_30 = 0;
  for (; local_2c != 0; local_2c = local_2c >> 1) {
    local_30 = local_30 + 1;
  }
  if (0xb < local_30) {
    *(undefined4 *)(*in_RDI + 0x28) = 6;
    (**(code **)*in_RDI)(in_RDI);
  }
  *(long *)(in_RCX + (long)local_30 * 8) = *(long *)(in_RCX + (long)local_30 * 8) + 1;
  local_38 = 0;
  for (local_34 = 1; local_34 < 0x40; local_34 = local_34 + 1) {
    local_2c = (int)in_RSI[jpeg_natural_order[local_34]];
    if (local_2c == 0) {
      local_38 = local_38 + 1;
    }
    else {
      for (; 0xf < local_38; local_38 = local_38 + -0x10) {
        in_R8[0xf0] = in_R8[0xf0] + 1;
      }
      if (local_2c < 0) {
        local_2c = -local_2c;
      }
      local_30 = 1;
      while (local_2c = local_2c >> 1, local_2c != 0) {
        local_30 = local_30 + 1;
      }
      if (10 < local_30) {
        *(undefined4 *)(*in_RDI + 0x28) = 6;
        (**(code **)*in_RDI)(in_RDI);
      }
      local_30 = local_38 * 0x10 + local_30;
      in_R8[local_30] = in_R8[local_30] + 1;
      local_38 = 0;
    }
  }
  if (0 < local_38) {
    *in_R8 = *in_R8 + 1;
  }
  return;
}

Assistant:

LOCAL(void)
htest_one_block(j_compress_ptr cinfo, JCOEFPTR block, int last_dc_val,
                long dc_counts[], long ac_counts[])
{
  register int temp;
  register int nbits;
  register int k, r;

  /* Encode the DC coefficient difference per section F.1.2.1 */

  temp = block[0] - last_dc_val;
  if (temp < 0)
    temp = -temp;

  /* Find the number of bits needed for the magnitude of the coefficient */
  nbits = 0;
  while (temp) {
    nbits++;
    temp >>= 1;
  }
  /* Check for out-of-range coefficient values.
   * Since we're encoding a difference, the range limit is twice as much.
   */
  if (nbits > MAX_COEF_BITS + 1)
    ERREXIT(cinfo, JERR_BAD_DCT_COEF);

  /* Count the Huffman symbol for the number of bits */
  dc_counts[nbits]++;

  /* Encode the AC coefficients per section F.1.2.2 */

  r = 0;                        /* r = run length of zeros */

  for (k = 1; k < DCTSIZE2; k++) {
    if ((temp = block[jpeg_natural_order[k]]) == 0) {
      r++;
    } else {
      /* if run length > 15, must emit special run-length-16 codes (0xF0) */
      while (r > 15) {
        ac_counts[0xF0]++;
        r -= 16;
      }

      /* Find the number of bits needed for the magnitude of the coefficient */
      if (temp < 0)
        temp = -temp;

      /* Find the number of bits needed for the magnitude of the coefficient */
      nbits = 1;                /* there must be at least one 1 bit */
      while ((temp >>= 1))
        nbits++;
      /* Check for out-of-range coefficient values */
      if (nbits > MAX_COEF_BITS)
        ERREXIT(cinfo, JERR_BAD_DCT_COEF);

      /* Count Huffman symbol for run length / number of bits */
      ac_counts[(r << 4) + nbits]++;

      r = 0;
    }
  }

  /* If the last coef(s) were zero, emit an end-of-block code */
  if (r > 0)
    ac_counts[0]++;
}